

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::Hub::stop(Hub *this)

{
  ulong in_RAX;
  ssize_t sVar1;
  DashelException *this_00;
  char c;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  sVar1 = write(*(int *)((long)this->hTerminate + 4),(void *)((long)&uStack_18 + 7),1);
  if (sVar1 == 1) {
    return;
  }
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (this_00,IOError,(int)sVar1,"Cannot write to termination pipe.",(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Hub::stop()
	{
		int* terminationPipes = (int*)hTerminate;
		char c = 0;
		const ssize_t ret = write(terminationPipes[1], &c, 1);
		if (ret != 1)
			throw DashelException(DashelException::IOError, ret, "Cannot write to termination pipe.");
	}